

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

nanoseconds __thiscall anon_unknown.dwarf_e23c::MovieState::getMasterClock(MovieState *this)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  pthread_mutex_t *__mutex;
  nanoseconds nVar4;
  
  if (this->mAVSyncType == Audio) {
    __mutex = (pthread_mutex_t *)&(this->mAudio).mSrcMutex;
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) goto LAB_00106579;
    nVar4 = AudioState::getClockNoLock(&this->mAudio);
  }
  else {
    if (this->mAVSyncType != Video) {
      lVar2 = av_gettime();
      return (nanoseconds)((lVar2 - (this->mClockBase).__r) * 1000);
    }
    __mutex = (pthread_mutex_t *)&(this->mVideo).mDispPtsMutex;
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 != 0) {
LAB_00106579:
      uVar3 = std::__throw_system_error(iVar1);
      pthread_mutex_unlock(__mutex);
      _Unwind_Resume(uVar3);
    }
    lVar2 = av_gettime();
    nVar4.__r = (lVar2 - (this->mVideo).mDisplayPtsTime.__r) * 1000 + (this->mVideo).mDisplayPts.__r
    ;
  }
  pthread_mutex_unlock(__mutex);
  return (nanoseconds)nVar4.__r;
}

Assistant:

nanoseconds MovieState::getMasterClock()
{
    if(mAVSyncType == SyncMaster::Video)
        return mVideo.getClock();
    if(mAVSyncType == SyncMaster::Audio)
        return mAudio.getClock();
    return getClock();
}